

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  ~IfcSIUnit((IfcSIUnit *)&this[-1].Name);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}